

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intCore.c
# Opt level: O3

void Inter_ManSetDefaultParams(Inter_ManParams_t *p)

{
  p->nBTLimit = 0;
  p->nFramesMax = 0;
  p->nSecLimit = 0;
  p->nFramesK = 0;
  p->fUseMiniSat = 0;
  p->fCheckKstep = 0;
  p->fUseBias = 0;
  p->fUseBackward = 0;
  p->fUseSeparate = 0;
  p->fUseTwoFrames = 0;
  p->fDropSatOuts = 0;
  p->fDropInvar = 0;
  p->fVerbose = 0;
  p->iFrameMax = 0;
  p->pFileName = (char *)0x0;
  p->fRewrite = 0;
  p->fTransLoop = 0;
  p->fUsePudlak = 0;
  p->fUseOther = 0;
  p->nFramesK = 1;
  p->fUseMiniSat = 0;
  p->fCheckKstep = 1;
  p->fUseBias = 0;
  p->fUseBackward = 0;
  p->fUseSeparate = 0;
  p->fUseTwoFrames = 0;
  p->fDropSatOuts = 0;
  p->iFrameMax = -1;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////`
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [This procedure sets default values of interpolation parameters.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Inter_ManSetDefaultParams( Inter_ManParams_t * p )
{ 
    memset( p, 0, sizeof(Inter_ManParams_t) );
    p->nBTLimit      = 0;     // limit on the number of conflicts
    p->nFramesMax    = 0;     // the max number timeframes to unroll
    p->nSecLimit     = 0;     // time limit in seconds
    p->nFramesK      = 1;     // the number of timeframes to use in induction
    p->fRewrite      = 0;     // use additional rewriting to simplify timeframes
    p->fTransLoop    = 0;     // add transition into the init state under new PI var
    p->fUsePudlak    = 0;     // use Pudluk interpolation procedure
    p->fUseOther     = 0;     // use other undisclosed option
    p->fUseMiniSat   = 0;     // use MiniSat-1.14p instead of internal proof engine
    p->fCheckKstep   = 1;     // check using K-step induction
    p->fUseBias      = 0;     // bias decisions to global variables
    p->fUseBackward  = 0;     // perform backward interpolation
    p->fUseSeparate  = 0;     // solve each output separately
    p->fUseTwoFrames = 0;     // create OR of two last timeframes
    p->fDropSatOuts  = 0;     // replace by 1 the solved outputs
    p->fVerbose      = 0;     // print verbose statistics
    p->iFrameMax     =-1;
}